

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourcesGL::LoadUniforms(ShaderResourcesGL *this,LoadUniformsAttribs *Attribs)

{
  ushort *puVar1;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *this_00;
  pointer pvVar2;
  char (*pacVar3) [30];
  GLuint GVar4;
  pointer pSVar5;
  void *ptr;
  undefined8 uVar6;
  pointer pUVar7;
  pointer pSVar8;
  pointer RangeStart;
  pointer RangeEnd;
  int iVar9;
  uint uVar10;
  GLuint GVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  ShaderCodeVariableDescX *this_01;
  ShaderCodeVariableDescX *pSVar20;
  IMemoryAllocator *RawAllocator;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  *Images_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Args_1;
  byte bVar21;
  ShaderCodeVariableDescX *pSVar22;
  pointer pSVar23;
  GLuint GVar24;
  size_t sVar25;
  vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
  *this_02;
  iterator __begin5;
  char *pcVar26;
  long lVar27;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar28;
  RESOURCE_DIMENSION ResDim;
  bool IsMS;
  GLenum err;
  string msg;
  GLenum dataType;
  GLint NameLen;
  SHADER_RESOURCE_TYPE ResourceType;
  PIPELINE_RESOURCE_FLAGS ResourceFlags;
  GLint size;
  vector<char,_std::allocator<char>_> Name;
  GLint numActiveShaderStorageBlocks;
  GLint activeUniformBlockMaxLength;
  GLenum err_4;
  GLint numActiveUniformBlocks;
  GLint numActiveUniforms;
  GLenum err_7;
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  UniformVars;
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  UniformBlocks;
  GLint activeUniformMaxLength;
  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  StorageBlocks;
  GLenum err_9;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  Images;
  vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  Textures;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  NamesPool;
  allocator local_2da;
  bool local_2d9;
  undefined1 local_2d8 [20];
  Uint32 UStack_2c4;
  undefined8 uStack_2c0;
  ShaderCodeVariableDesc *local_2b8;
  undefined1 local_2a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  pointer local_288;
  _Alloc_hider local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Alloc_hider local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  local_240;
  ShaderCodeVariableDescX *local_228;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  uint local_214;
  char *local_210;
  ShaderCodeVariableDescX *local_208;
  string local_200;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  char *local_1d8;
  char local_1d0;
  undefined7 uStack_1cf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  vector<char,_std::allocator<char>_> local_1b8;
  GLint local_1a0;
  uint local_19c;
  ShaderCodeBufferDescX local_198;
  char *local_168;
  GLint local_160;
  GLint local_15c;
  long *local_158 [2];
  long local_148 [2];
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  local_138;
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  local_118;
  ShaderResourcesGL *local_f8;
  uint local_f0;
  uint local_ec;
  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  local_e8;
  vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_> local_c8
  ;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  local_a8;
  vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_f8 = this;
  if ((Attribs->SamplerResourceFlag & ~PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) !=
      PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[100]>
              ((string *)local_2a8,
               (char (*) [100])
               "Only NONE (for GLSL source) and COMBINED_SAMPLER (for HLSL source) are valid sampler resource flags"
              );
    DebugAssertionFailed
              ((Char *)local_2a8._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1c8);
    if ((char (*) [30])local_2a8._0_8_ != (char (*) [30])(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
    }
  }
  local_118.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_138.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (Attribs->GLProgram->m_uiHandle == 0) {
    FormatString<char[16]>((string *)local_2a8,(char (*) [16])"Null GL program");
    DebugAssertionFailed
              ((Char *)local_2a8._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1d6);
    if ((char (*) [30])local_2a8._0_8_ != (char (*) [30])(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
    }
  }
  GLContextState::SetProgram(Attribs->State,Attribs->GLProgram);
  GVar4 = Attribs->GLProgram->m_uiHandle;
  local_f8->m_ShaderStages = Attribs->ShaderStages;
  local_15c = 0;
  (*__glewGetProgramiv)(GVar4,0x8b86,&local_15c);
  local_2d8._0_4_ = glGetError();
  if (local_2d8._0_4_ != 0) {
    LogError<false,char[45],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1de,(char (*) [45])"Unable to get the number of active uniforms\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
    FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
    DebugAssertionFailed
              ((Char *)local_2a8._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1de);
    if ((char (*) [30])local_2a8._0_8_ != (char (*) [30])(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
    }
  }
  local_ec = 0;
  (*__glewGetProgramiv)(GVar4,0x8b87,(GLint *)&local_ec);
  local_2d8._0_4_ = glGetError();
  if (local_2d8._0_4_ != 0) {
    LogError<false,char[47],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e3,(char (*) [47])"Unable to get the maximum uniform name length\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
    FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
    DebugAssertionFailed
              ((Char *)local_2a8._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e3);
    if ((char (*) [30])local_2a8._0_8_ != (char (*) [30])(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
    }
  }
  local_160 = 0;
  (*__glewGetProgramiv)(GVar4,0x8a36,&local_160);
  local_2d8._0_4_ = glGetError();
  if (local_2d8._0_4_ != 0) {
    LogError<false,char[51],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e7,(char (*) [51])"Unable to get the number of active uniform blocks\n",
               (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
    FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
    DebugAssertionFailed
              ((Char *)local_2a8._0_8_,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e7);
    if ((char (*) [30])local_2a8._0_8_ != (char (*) [30])(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
    }
  }
  local_19c = 0;
  (*__glewGetProgramiv)(GVar4,0x8a35,(GLint *)&local_19c);
  iVar9 = glGetError();
  if (iVar9 != 0) {
    FormatString<char[53]>
              ((string *)local_2a8,
               (char (*) [53])"Unable to get the maximum uniform block name length.");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_2a8._0_8_,0,0,0);
    }
    if ((char (*) [30])local_2a8._0_8_ != (char (*) [30])(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
    }
  }
  if ((int)local_19c < 1) {
    local_19c = 0x400;
  }
  uVar14 = local_19c;
  if ((int)local_19c < (int)local_ec) {
    uVar14 = local_ec;
  }
  pSVar22 = (ShaderCodeVariableDescX *)(ulong)uVar14;
  local_1a0 = 0;
  if (__glewGetProgramInterfaceiv != (PFNGLGETPROGRAMINTERFACEIVPROC)0x0) {
    (*__glewGetProgramInterfaceiv)(GVar4,0x92e6,0x92f5,&local_1a0);
    uVar10 = glGetError();
    if (uVar10 != 0) {
      local_2d8._0_4_ = uVar10;
      LogError<false,char[51],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x201,(char (*) [51])"Unable to get the number of shader storage blocks\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
      FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
      DebugAssertionFailed
                ((Char *)local_2a8._0_8_,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x201);
      if ((char (*) [30])local_2a8._0_8_ != (char (*) [30])(local_2a8 + 0x10)) {
        operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
      }
    }
    local_2d8._0_8_ = (ulong)(uint)local_2d8._4_4_ << 0x20;
    (*__glewGetProgramInterfaceiv)(GVar4,0x92e6,0x92f6,(GLint *)local_2d8);
    local_198.super_ShaderCodeBufferDesc.Size = glGetError();
    if (local_198.super_ShaderCodeBufferDesc.Size != 0) {
      LogError<false,char[60],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x206,(char (*) [60])
                        "Unable to get the maximum shader storage block name length\n",
                 (char (*) [17])"\nGL Error Code: ",(uint *)&local_198);
      FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
      DebugAssertionFailed
                ((Char *)local_2a8._0_8_,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x206);
      if ((char (*) [30])local_2a8._0_8_ != (char (*) [30])(local_2a8 + 0x10)) {
        operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
      }
    }
    pSVar22 = (ShaderCodeVariableDescX *)(ulong)uVar14;
    if ((int)uVar14 <= (int)local_2d8._0_4_) {
      pSVar22 = (ShaderCodeVariableDescX *)(local_2d8._0_8_ & 0xffffffff);
    }
  }
  local_208 = (ShaderCodeVariableDescX *)0x200;
  if (0x200 < (int)pSVar22) {
    local_208 = pSVar22;
  }
  local_228 = (ShaderCodeVariableDescX *)Attribs;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_1b8,(ulong)((int)local_208 + 1),(allocator_type *)local_2a8);
  if (0 < local_15c) {
    pacVar3 = (char (*) [30])(local_2a8 + 0x10);
    GVar24 = 0;
    do {
      local_220._M_current = local_220._M_current & 0xffffffff00000000;
      local_1c0._M_current = local_1c0._M_current & 0xffffffff00000000;
      local_214 = 0;
      (*__glewGetActiveUniform)
                (GVar4,GVar24,(GLsizei)local_208,(GLsizei *)&local_214,(GLint *)&local_1c0,
                 (GLenum *)&local_220,
                 local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar9 = glGetError();
      local_2d8._0_4_ = iVar9;
      if (iVar9 != 0) {
        LogError<false,char[30],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x218,(char (*) [30])"Unable to get active uniform\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x218);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      sVar25 = (size_t)(int)local_214;
      if (((int)local_208 <= (int)local_214) ||
         (sVar15 = strlen(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start), sVar15 != sVar25)) {
        FormatString<char[23]>((string *)local_2a8,(char (*) [23])"Incorrect uniform name");
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x219);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      if ((int)local_1c0._M_current < 1) {
        FormatString<char[34]>
                  ((string *)local_2a8,(char (*) [34])"Size is expected to be at least 1");
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x21a);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      GLTextureTypeToResourceDim
                ((GLenum)local_220._M_current,(RESOURCE_DIMENSION *)&local_2da,&local_2d9);
      if ((int)(GLenum)local_220._M_current < 0x900c) {
        if (((((GLenum)local_220._M_current - 0x8dc0 < 0x19) &&
             ((0x1dfde3fU >> ((GLenum)local_220._M_current - 0x8dc0 & 0x1f) & 1) != 0)) ||
            ((GLenum)local_220._M_current - 0x8b5d < 6)) || ((GLenum)local_220._M_current == 0x8d66)
           ) goto LAB_003018a7;
LAB_00301997:
        if (*(bool *)&(local_228->super_ShaderCodeVariableDesc).ArraySize == true) {
          GLDataTypeToShaderCodeVariableDesc
                    ((ShaderCodeVariableDesc *)local_2a8,(GLenum)local_220._M_current);
          if (local_298._M_local_buf[1] != '\0') {
            local_2a8._0_8_ =
                 local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_210 = (char *)CONCAT44(local_210._4_4_,
                                         (local_228->super_ShaderCodeVariableDesc).NumMembers);
            local_198.super_ShaderCodeBufferDesc.Size = GVar24;
            local_200._M_dataplus._M_p._0_4_ = 0xffffffff;
            (*__glewGetActiveUniformsiv)(GVar4,1,(GLuint *)&local_198,0x8a3a,(GLint *)&local_200);
            iVar9 = glGetError();
            local_1e0._M_current._0_4_ = iVar9;
            if (iVar9 != 0) {
              LogError<false,char[51],unsigned_int,char[17],unsigned_int>
                        (false,"AddUniformBufferVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0xde,(char (*) [51])"Failed to get the uniform block index for uniform ",
                         (uint *)&local_198,(char (*) [17])"\nGL Error Code: ",(uint *)&local_1e0);
              FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x861532);
              DebugAssertionFailed
                        ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0xde);
              if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
              }
            }
            uVar19 = (ulong)(int)(GLuint)local_200._M_dataplus._M_p;
            if (-1 < (long)uVar19) {
              uVar17 = ((long)local_138.
                              super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              if (uVar17 < uVar19 || uVar17 - uVar19 == 0) {
                std::
                vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                ::resize(&local_138,(ulong)((GLuint)local_200._M_dataplus._M_p + 1));
              }
              this_02 = (vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                         *)(local_138.
                            super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                           (int)(GLuint)local_200._M_dataplus._M_p);
              std::
              vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
              ::emplace_back<Diligent::ShaderCodeVariableDesc_const&>
                        (this_02,(ShaderCodeVariableDesc *)local_2a8);
              lVar27 = *(long *)(this_02 + 8);
              if ((GLuint)local_210 == 1) {
                if (*(char *)(lVar27 + -0x70) == '\x02') {
                  puVar1 = (ushort *)(lVar27 + -0x6e);
                  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                }
                ShaderCodeVariableDescX::SetDefaultTypeName
                          ((ShaderCodeVariableDescX *)(lVar27 + -0x80),SHADER_SOURCE_LANGUAGE_HLSL);
              }
              if ((byte)(*(char *)(lVar27 + -0x70) - 3U) < 2) {
                local_1e0._M_current._0_4_ = 0xffffffff;
                (*__glewGetActiveUniformsiv)
                          (GVar4,1,(GLuint *)&local_198,0x8a3e,(GLint *)&local_1e0);
                iVar9 = glGetError();
                local_158[0] = (long *)CONCAT44(local_158[0]._4_4_,iVar9);
                if (iVar9 != 0) {
                  LogError<false,char[65],char[17],unsigned_int>
                            (false,"AddUniformBufferVariable",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0xfc,(char (*) [65])
                                   "Failed to get the value of the GL_UNIFORM_IS_ROW_MAJOR parameter"
                             ,(char (*) [17])"\nGL Error Code: ",(uint *)local_158);
                  FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x861532);
                  DebugAssertionFailed
                            ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0xfc);
                  if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                    operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                  }
                }
                if (-1 < (int)local_1e0._M_current) {
                  *(char *)(lVar27 + -0x70) = ((int)local_1e0._M_current == 0) + '\x03';
                }
              }
              local_1e0._M_current._0_4_ = 0xffffffff;
              (*__glewGetActiveUniformsiv)(GVar4,1,(GLuint *)&local_198,0x8a3c,(GLint *)&local_1e0);
              iVar9 = glGetError();
              local_158[0]._0_4_ = iVar9;
              if (iVar9 != 0) {
                LogError<false,char[65],char[17],unsigned_int>
                          (false,"AddUniformBufferVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                           ,0x10a,(char (*) [65])
                                  "Failed to get the value of the GL_UNIFORM_ARRAY_STRIDE parameter"
                           ,(char (*) [17])"\nGL Error Code: ",(uint *)local_158);
                FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x861532);
                DebugAssertionFailed
                          ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                           ,0x10a);
                if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                  operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                }
              }
              if (0 < (int)local_1e0._M_current) {
                local_158[0]._0_4_ = -1;
                (*__glewGetActiveUniformsiv)(GVar4,1,(GLuint *)&local_198,0x8a38,(GLint *)local_158)
                ;
                iVar9 = glGetError();
                local_c8.
                super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_c8.
                                       super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar9);
                if (iVar9 != 0) {
                  LogError<false,char[57],char[17],unsigned_int>
                            (false,"AddUniformBufferVariable",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0x110,(char (*) [57])
                                    "Failed to get the value of the GL_UNIFORM_SIZE parameter",
                             (char (*) [17])"\nGL Error Code: ",(uint *)&local_c8);
                  FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x861532);
                  DebugAssertionFailed
                            ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0x110);
                  if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                    operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                  }
                }
                if (0 < (int)local_158[0]) {
                  *(int *)(lVar27 + -0x68) = (int)local_158[0];
                }
              }
              local_1e0._M_current._0_4_ = 0xffffffff;
              (*__glewGetActiveUniformsiv)(GVar4,1,(GLuint *)&local_198,0x8a3b,(GLint *)&local_1e0);
              iVar9 = glGetError();
              local_158[0] = (long *)CONCAT44(local_158[0]._4_4_,iVar9);
              if (iVar9 != 0) {
                LogError<false,char[59],char[17],unsigned_int>
                          (false,"AddUniformBufferVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                           ,0x11a,(char (*) [59])
                                  "Failed to get the value of the GL_UNIFORM_OFFSET parameter",
                           (char (*) [17])"\nGL Error Code: ",(uint *)local_158);
                FormatString<char[6]>((string *)local_2d8,(char (*) [6])0x861532);
                DebugAssertionFailed
                          ((Char *)local_2d8._0_8_,"AddUniformBufferVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                           ,0x11a);
                if ((char (*) [30])local_2d8._0_8_ != (char (*) [30])(local_2d8 + 0x10)) {
                  operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                }
              }
              if (-1 < (int)local_1e0._M_current) {
                *(int *)(lVar27 + -0x6c) = (int)local_1e0._M_current;
              }
            }
          }
        }
      }
      else if ((GLenum)local_220._M_current - 0x904c < 0x21) {
        bVar21 = (byte)(0x400801 >> ((byte)((GLenum)local_220._M_current - 0x9051) & 0x1f)) &
                 (GLenum)local_220._M_current - 0x9051 < 0x17;
        local_200._M_dataplus._M_p._0_1_ = bVar21 + 4;
        local_1e0._M_current._0_1_ = bVar21 << 2;
        pcVar16 = strchr(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,0x5b);
        if (pcVar16 != (char *)0x0) {
          *pcVar16 = '\0';
        }
        local_2d8._0_8_ =
             local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        pVar28 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_68,local_2d8);
        local_2a8._0_8_ =
             *(undefined8 *)
              ((long)pVar28.first.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              + 8);
        local_198.super_ShaderCodeBufferDesc.Size = (int)local_1c0._M_current;
        std::
        vector<Diligent::ShaderResourcesGL::ImageInfo,std::allocator<Diligent::ShaderResourcesGL::ImageInfo>>
        ::
        emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&,unsigned_int,unsigned_int&,Diligent::RESOURCE_DIMENSION&,bool&>
                  ((vector<Diligent::ShaderResourcesGL::ImageInfo,std::allocator<Diligent::ShaderResourcesGL::ImageInfo>>
                    *)&local_a8,(char **)local_2a8,(SHADER_TYPE *)local_228,
                   (SHADER_RESOURCE_TYPE *)&local_200,(PIPELINE_RESOURCE_FLAGS *)&local_1e0,
                   (uint *)&local_198,(uint *)&local_220,(RESOURCE_DIMENSION *)&local_2da,&local_2d9
                  );
      }
      else {
        if ((5 < (GLenum)local_220._M_current - 0x9108) &&
           (3 < (GLenum)local_220._M_current - 0x900c)) goto LAB_00301997;
LAB_003018a7:
        bVar21 = (byte)(0x404001 >> ((byte)((GLenum)local_220._M_current - 0x8dc2) & 0x1f)) &
                 (GLenum)local_220._M_current - 0x8dc2 < 0x17;
        local_200._M_dataplus._M_p._0_1_ = bVar21 + 2;
        local_1e0._M_current._0_1_ = 4;
        if (bVar21 == 0) {
          local_1e0._M_current._0_1_ =
               (char)*(undefined4 *)((long)&(local_228->super_ShaderCodeVariableDesc).Name + 4);
        }
        pcVar16 = strchr(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,0x5b);
        if (pcVar16 != (char *)0x0) {
          *pcVar16 = '\0';
        }
        local_2d8._0_8_ =
             local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        pVar28 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_68,local_2d8);
        local_2a8._0_8_ =
             *(undefined8 *)
              ((long)pVar28.first.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              + 8);
        local_198.super_ShaderCodeBufferDesc.Size = (int)local_1c0._M_current;
        std::
        vector<Diligent::ShaderResourcesGL::TextureInfo,std::allocator<Diligent::ShaderResourcesGL::TextureInfo>>
        ::
        emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&,unsigned_int,unsigned_int&,Diligent::RESOURCE_DIMENSION&,bool&>
                  ((vector<Diligent::ShaderResourcesGL::TextureInfo,std::allocator<Diligent::ShaderResourcesGL::TextureInfo>>
                    *)&local_88,(char **)local_2a8,(SHADER_TYPE *)local_228,
                   (SHADER_RESOURCE_TYPE *)&local_200,(PIPELINE_RESOURCE_FLAGS *)&local_1e0,
                   (uint *)&local_198,(uint *)&local_220,(RESOURCE_DIMENSION *)&local_2da,&local_2d9
                  );
      }
      GVar24 = GVar24 + 1;
    } while ((int)GVar24 < local_15c);
  }
  if (0 < local_160) {
    pacVar3 = (char (*) [30])(local_2a8 + 0x10);
    GVar24 = 0;
    do {
      local_198.super_ShaderCodeBufferDesc._0_8_ =
           local_198.super_ShaderCodeBufferDesc._0_8_ & 0xffffffff00000000;
      pcVar16 = local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*__glewGetActiveUniformBlockName)
                (GVar4,GVar24,(GLsizei)local_208,(GLsizei *)&local_198,
                 local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar9 = glGetError();
      local_2d8._0_4_ = iVar9;
      if (iVar9 != 0) {
        pcVar16 = "Unable to get active uniform block name\n";
        LogError<false,char[41],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2c8,(char (*) [41])"Unable to get active uniform block name\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2c8);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      sVar25 = (size_t)(int)local_198.super_ShaderCodeBufferDesc.Size;
      if (((int)local_208 <= (int)local_198.super_ShaderCodeBufferDesc.Size) ||
         (sVar15 = strlen(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start), sVar15 != sVar25)) {
        FormatString<char[29]>((string *)local_2a8,(char (*) [29])"Incorrect uniform block name");
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2c9);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      GVar11 = (*__glewGetUniformBlockIndex)
                         (GVar4,local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
      local_200._M_dataplus._M_p._0_4_ = GVar11;
      iVar9 = glGetError();
      local_2d8._0_4_ = iVar9;
      if (iVar9 != 0) {
        pcVar16 = "Unable to get active uniform block index\n";
        LogError<false,char[42],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2d0,(char (*) [42])"Unable to get active uniform block index\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2d0);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      pcVar18 = strchr(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,0x5b);
      if (pcVar18 == (char *)0x0) {
        iVar9 = 1;
LAB_0030220b:
        local_2d8._0_8_ =
             local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        pVar28 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_68,local_2d8);
        local_2a8._0_8_ =
             *(undefined8 *)
              ((long)pVar28.first.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              + 8);
        local_158[0] = (long *)CONCAT71(local_158[0]._1_7_,1);
        local_1e0._M_current._0_4_ = iVar9;
        std::
        vector<Diligent::ShaderResourcesGL::UniformBufferInfo,std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>>
        ::
        emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE,unsigned_int,unsigned_int&>
                  ((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>>
                    *)&local_118,(char **)local_2a8,(SHADER_TYPE *)local_228,
                   (SHADER_RESOURCE_TYPE *)local_158,(uint *)&local_1e0,(uint *)&local_200);
      }
      else {
        local_210 = (char *)CONCAT44(local_210._4_4_,GVar24);
        iVar12 = atoi(pcVar18 + 1);
        pUVar7 = local_118.
                 super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar26 = (char *)local_118.
                          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        iVar9 = 0;
        if (0 < iVar12) {
          iVar9 = iVar12;
        }
        iVar9 = iVar9 + 1;
        *pcVar18 = '\0';
        if (local_118.
            super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_118.
            super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          GVar24 = (GLuint)local_210;
          goto LAB_0030220b;
        }
        iVar13 = strcmp(*(char **)*(char (*) [30])
                                   ((long)local_118.
                                          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + -0x18),
                        local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        local_168 = (char *)CONCAT44(local_168._4_4_,iVar13);
        GVar24 = (GLuint)local_210;
        if (iVar13 == 0) {
          iVar13 = *(int *)((long)pUVar7 + -8);
          if (*(int *)((long)pUVar7 + -8) < iVar9) {
            iVar13 = iVar9;
          }
          iVar9 = iVar13;
          if ((GLuint)local_200._M_dataplus._M_p != iVar12 + *(int *)((long)pUVar7 + -4)) {
            FormatString<char[52]>
                      ((string *)local_2a8,
                       (char (*) [52])"Uniform block indices are expected to be continuous");
            DebugAssertionFailed
                      ((Char *)local_2a8._0_8_,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x2e5);
            if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
              operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
            }
          }
          *(int *)((long)pUVar7 + -8) = iVar9;
        }
        else {
          for (; (pointer)pcVar26 != pUVar7; pcVar26 = pcVar26 + 0x18) {
            iVar12 = strcmp(*(char **)pcVar26,
                            local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            if (iVar12 == 0) {
              FormatString<char[30],char_const*,char[30]>
                        ((string *)local_2a8,(Diligent *)"Uniform block with the name \'",
                         (char (*) [30])pcVar26,(char **)"\' has already been enumerated",
                         (char (*) [30])pcVar16);
              DebugAssertionFailed
                        ((Char *)local_2a8._0_8_,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x2ed);
              if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
                operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
              }
            }
          }
        }
        if ((int)local_168 != 0) goto LAB_0030220b;
      }
      GVar24 = GVar24 + 1;
    } while ((int)GVar24 < local_160);
  }
  if (0 < local_1a0) {
    pacVar3 = (char (*) [30])(local_2a8 + 0x10);
    GVar24 = 0;
    do {
      local_198.super_ShaderCodeBufferDesc._0_8_ =
           local_198.super_ShaderCodeBufferDesc._0_8_ & 0xffffffff00000000;
      pcVar16 = (char *)&local_198;
      (*__glewGetProgramResourceName)
                (GVar4,0x92e6,GVar24,(GLsizei)local_208,(GLsizei *)pcVar16,
                 local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar9 = glGetError();
      local_2d8._0_4_ = iVar9;
      if (iVar9 != 0) {
        pcVar16 = "Unable to get shader storage block name\n";
        LogError<false,char[41],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x304,(char (*) [41])"Unable to get shader storage block name\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x304);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      sVar25 = (size_t)(int)local_198.super_ShaderCodeBufferDesc.Size;
      if (((int)local_208 <= (int)local_198.super_ShaderCodeBufferDesc.Size) ||
         (sVar15 = strlen(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start), sVar15 != sVar25)) {
        FormatString<char[36]>
                  ((string *)local_2a8,(char (*) [36])"Incorrect shader storage block name");
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x305);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      GVar11 = (*__glewGetProgramResourceIndex)
                         (GVar4,0x92e6,
                          local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      local_200._M_dataplus._M_p._0_4_ = GVar11;
      iVar9 = glGetError();
      local_2d8._0_4_ = iVar9;
      if (iVar9 != 0) {
        pcVar16 = "Unable to get shader storage block index\n";
        LogError<false,char[42],char[17],unsigned_int>
                  (false,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x308,(char (*) [42])"Unable to get shader storage block index\n",
                   (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
        FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
        DebugAssertionFailed
                  ((Char *)local_2a8._0_8_,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x308);
        if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
          operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
        }
      }
      pcVar18 = strchr(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,0x5b);
      if (pcVar18 == (char *)0x0) {
        iVar9 = 1;
LAB_003025ef:
        local_2d8._0_8_ =
             local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        pVar28 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)&local_68,local_2d8);
        local_2a8._0_8_ =
             *(undefined8 *)
              ((long)pVar28.first.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              + 8);
        local_158[0] = (long *)CONCAT71(local_158[0]._1_7_,5);
        local_1e0._M_current._0_4_ = iVar9;
        std::
        vector<Diligent::ShaderResourcesGL::StorageBlockInfo,std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>>
        ::
        emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE,unsigned_int,unsigned_int&>
                  ((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>>
                    *)&local_e8,(char **)local_2a8,(SHADER_TYPE *)local_228,
                   (SHADER_RESOURCE_TYPE *)local_158,(uint *)&local_1e0,(uint *)&local_200);
      }
      else {
        local_210 = (char *)CONCAT44(local_210._4_4_,GVar24);
        iVar12 = atoi(pcVar18 + 1);
        pSVar8 = local_e8.
                 super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar26 = (char *)local_e8.
                          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        iVar9 = 0;
        if (0 < iVar12) {
          iVar9 = iVar12;
        }
        iVar9 = iVar9 + 1;
        *pcVar18 = '\0';
        if (local_e8.
            super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_e8.
            super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          GVar24 = (GLuint)local_210;
          goto LAB_003025ef;
        }
        iVar13 = strcmp(*(char **)((long)local_e8.
                                         super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + -0x18),
                        local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        local_168 = (char *)CONCAT44(local_168._4_4_,iVar13);
        if (iVar13 == 0) {
          iVar13 = *(int *)((long)pSVar8 + -8);
          if (*(int *)((long)pSVar8 + -8) < iVar9) {
            iVar13 = iVar9;
          }
          iVar9 = iVar13;
          if ((GLuint)local_200._M_dataplus._M_p != iVar12 + *(int *)((long)pSVar8 + -4)) {
            FormatString<char[52]>
                      ((string *)local_2a8,
                       (char (*) [52])"Storage block indices are expected to be continuous");
            DebugAssertionFailed
                      ((Char *)local_2a8._0_8_,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x319);
            if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
              operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
            }
          }
          *(int *)((long)pSVar8 + -8) = iVar9;
        }
        else {
          for (; (pointer)pcVar26 != pSVar8; pcVar26 = pcVar26 + 0x18) {
            iVar12 = strcmp(*(char **)pcVar26,
                            local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            if (iVar12 == 0) {
              FormatString<char[30],char_const*,char[30]>
                        ((string *)local_2a8,(Diligent *)"Storage block with the name \"",
                         (char (*) [30])pcVar26,(char **)"\" has already been enumerated",
                         (char (*) [30])pcVar16);
              DebugAssertionFailed
                        ((Char *)local_2a8._0_8_,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x321);
              if ((char (*) [30])local_2a8._0_8_ != pacVar3) {
                operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
              }
            }
          }
        }
        GVar24 = (GLuint)local_210;
        if ((int)local_168 != 0) goto LAB_003025ef;
      }
      GVar24 = GVar24 + 1;
    } while ((int)GVar24 < local_1a0);
  }
  local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  local_2a8._8_8_ = (ulong)(uint)local_2a8._12_4_ << 0x20;
  GLContextState::SetProgram
            (*(GLContextState **)&(local_228->super_ShaderCodeVariableDesc).Class,
             (GLProgramObj *)local_2a8);
  if (local_2a8._0_4_ != 0) {
    (*__glewDeleteProgram)(local_2a8._0_4_);
    local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffff00000000;
  }
  Images_00 = &local_a8;
  pcVar16 = (char *)&local_e8;
  AllocateResources(local_f8,&local_118,&local_88,Images_00,
                    (vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                     *)pcVar16);
  if (local_138.
      super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (*(bool *)&(local_228->super_ShaderCodeVariableDesc).ArraySize == false) {
      FormatString<char[26],char[36]>
                ((string *)local_2a8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Attribs.LoadUniformBufferReflection",(char (*) [36])Images_00);
      DebugAssertionFailed
                ((Char *)local_2a8._0_8_,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x33a);
      if ((IMemoryAllocator *)local_2a8._0_8_ != (IMemoryAllocator *)(local_2a8 + 0x10)) {
        operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
      }
    }
    local_c8.
    super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
    ._M_impl.super__Vector_impl_data._M_start = (ShaderCodeBufferDescX *)0x0;
    local_c8.
    super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
    ._M_impl.super__Vector_impl_data._M_finish = (ShaderCodeBufferDescX *)0x0;
    local_c8.
    super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168 = (char *)local_118.
                        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    if (local_118.
        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_118.
        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar18 = (char *)local_118.
                        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      do {
        pvVar2 = local_138.
                 super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = (ulong)*(uint *)(pcVar18 + 0x14);
        uVar19 = ((long)local_138.
                        super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_138.
                        super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        local_210 = pcVar18;
        if (uVar19 < uVar17 || uVar19 - uVar17 == 0) {
          FormatString<char[15],unsigned_int,char[19]>
                    ((string *)local_2a8,(Diligent *)"Uniform block ",
                     (char (*) [15])(pcVar18 + 0x14),(uint *)" has no variables.",
                     (char (*) [19])pcVar16);
          DebugAssertionFailed
                    ((Char *)local_2a8._0_8_,"LoadUniforms",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0x34b);
          if ((IMemoryAllocator *)local_2a8._0_8_ != (IMemoryAllocator *)(local_2a8 + 0x10)) {
            operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
          }
        }
        else {
          local_214 = 0;
          (*__glewGetActiveUniformBlockiv)
                    (GVar4,*(uint *)(pcVar18 + 0x14),0x8a40,(GLint *)&local_214);
          iVar9 = glGetError();
          local_2d8._0_4_ = iVar9;
          if (iVar9 != 0) {
            pcVar16 = "Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter";
            LogError<false,char[68],char[17],unsigned_int>
                      (false,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x345,(char (*) [68])
                              "Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter",
                       (char (*) [17])"\nGL Error Code: ",(uint *)local_2d8);
            FormatString<char[6]>((string *)local_2a8,(char (*) [6])0x861532);
            DebugAssertionFailed
                      ((Char *)local_2a8._0_8_,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x345);
            if ((IMemoryAllocator *)local_2a8._0_8_ != (IMemoryAllocator *)(local_2a8 + 0x10)) {
              operator_delete((void *)local_2a8._0_8_,local_298._M_allocated_capacity + 1);
            }
          }
          pvVar2 = pvVar2 + uVar17;
          local_f0 = local_214;
          pSVar23 = (pvVar2->
                    super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pSVar5 = (pvVar2->
                   super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar23 != pSVar5) {
            uVar19 = (long)pSVar5 - (long)pSVar23 >> 7;
            lVar27 = 0x3f;
            if (uVar19 != 0) {
              for (; uVar19 >> lVar27 == 0; lVar27 = lVar27 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                      (pSVar23,pSVar5,((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
            if ((long)pSVar5 - (long)pSVar23 < 0x801) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                        (pSVar23);
            }
            else {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                        (pSVar23);
              for (pSVar23 = pSVar23 + 0x10; pSVar23 != pSVar5; pSVar23 = pSVar23 + 1) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Val_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                          (pSVar23);
              }
            }
          }
          local_298._M_allocated_capacity = 0;
          local_298._8_8_ = 0;
          local_2a8._0_8_ = (IMemoryAllocator *)0x0;
          local_2a8._8_8_ = (ShaderCodeVariableDesc *)0x0;
          local_288 = (pointer)0x0;
          local_280._M_p = (pointer)&local_270;
          local_278 = 0;
          local_270._M_local_buf[0] = '\0';
          local_260._M_p = (pointer)&local_250;
          local_258 = 0;
          local_250._M_local_buf[0] = '\0';
          local_240.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_240.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_start = (ShaderCodeVariableDescX *)0x0;
          local_240.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pSVar22 = (pvVar2->
                    super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_228 = (pvVar2->
                      super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar22 != local_228) {
            do {
              pcVar16 = (pSVar22->super_ShaderCodeVariableDesc).Name;
              local_208 = pSVar22;
              pcVar18 = strchr(pcVar16,0x2e);
              if (pcVar18 == (char *)0x0) {
                this_01 = (ShaderCodeVariableDescX *)local_2a8;
              }
              else {
                pSVar22 = (ShaderCodeVariableDescX *)local_2a8;
                do {
                  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_200,pcVar16,pcVar18);
                  local_1e0._M_current = &local_1d0;
                  local_1d8 = (char *)0x0;
                  local_1d0 = '\0';
                  local_220._M_current = local_200._M_dataplus._M_p;
                  local_2d8._0_8_ = local_200._M_dataplus._M_p + local_200._M_string_length;
                  local_1c0._M_current = (char *)local_2d8._0_8_;
                  iVar9 = Parsing::
                          GetArrayIndex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                    (&local_220,&local_1c0,
                                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_2d8);
                  Args_1._M_current = local_220._M_current;
                  std::__cxx11::string::replace
                            ((ulong)&local_1e0,0,local_1d8,(ulong)local_220._M_current);
                  this_01 = ShaderCodeVariableDescX::FindMember(pSVar22,local_1e0._M_current);
                  if (this_01 == (ShaderCodeVariableDescX *)0x0) {
                    local_2d8._8_8_ = (char *)0x0;
                    uStack_2c0 = 0;
                    local_2b8 = (ShaderCodeVariableDesc *)0x0;
                    local_2d8._0_8_ = local_1e0._M_current;
                    UStack_2c4 = (local_208->super_ShaderCodeVariableDesc).Offset;
                    local_2d8._16_4_ = 5;
                    pSVar23 = (pSVar22->Members).
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pSVar5 = (pSVar22->Members).
                             super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    std::
                    vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                    ::emplace_back<Diligent::ShaderCodeVariableDesc_const&>
                              ((vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                                *)&pSVar22->Members,(ShaderCodeVariableDesc *)local_2d8);
                    lVar27 = (long)pSVar5 - (long)pSVar23;
                    pSVar23 = (pSVar22->Members).
                              super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    (pSVar22->super_ShaderCodeVariableDesc).NumMembers =
                         (Uint32)((ulong)((long)(pSVar22->Members).
                                                super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pSVar23) >> 7);
                    (pSVar22->super_ShaderCodeVariableDesc).pMembers =
                         &pSVar23->super_ShaderCodeVariableDesc;
                    this_01 = (ShaderCodeVariableDescX *)((long)pSVar23 + lVar27);
                    uVar14 = *(uint *)((long)pSVar23 + lVar27 + 0x18);
                    uVar10 = iVar9 + 1U;
                    if (iVar9 + 1U < uVar14) {
                      uVar10 = uVar14;
                    }
                    *(uint *)((long)pSVar23 + lVar27 + 0x18) = uVar10;
                  }
                  else {
                    uVar14 = (this_01->super_ShaderCodeVariableDesc).ArraySize;
                    uVar10 = iVar9 + 1U;
                    if (iVar9 + 1U < uVar14) {
                      uVar10 = uVar14;
                    }
                    (this_01->super_ShaderCodeVariableDesc).ArraySize = uVar10;
                    if ((local_208->super_ShaderCodeVariableDesc).Offset <
                        (this_01->super_ShaderCodeVariableDesc).Offset) {
                      FormatString<char[26],char[27]>
                                ((string *)local_2d8,(Diligent *)"Debug expression failed:\n",
                                 (char (*) [26])"Var.Offset >= pVar->Offset",
                                 (char (*) [27])Args_1._M_current);
                      DebugAssertionFailed
                                ((Char *)local_2d8._0_8_,"PrepareUBReflection",
                                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                                 ,0x170);
                      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                        operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
                      }
                    }
                  }
                  pcVar16 = pcVar18 + 1;
                  pcVar18 = strchr(pcVar16,0x2e);
                  if (local_1e0._M_current != &local_1d0) {
                    operator_delete(local_1e0._M_current,CONCAT71(uStack_1cf,local_1d0) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_200._M_dataplus._M_p != &local_200.field_2) {
                    operator_delete(local_200._M_dataplus._M_p,
                                    local_200.field_2._M_allocated_capacity + 1);
                  }
                  pSVar22 = this_01;
                } while (pcVar18 != (char *)0x0);
              }
              local_2d8._0_8_ = local_2d8 + 0x10;
              local_2d8._8_8_ = (char *)0x0;
              stack0xfffffffffffffd38 = stack0xfffffffffffffd38 & 0xffffffffffffff00;
              std::__cxx11::string::string((string *)&local_200,pcVar16,&local_2da);
              local_220._M_current = local_200._M_dataplus._M_p;
              local_1e0._M_current = local_200._M_dataplus._M_p + local_200._M_string_length;
              local_1c0._M_current = local_1e0._M_current;
              iVar9 = Parsing::
                      GetArrayIndex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                (&local_220,&local_1c0,&local_1e0);
              pcVar16 = local_1e0._M_current + -(long)local_220._M_current;
              std::__cxx11::string::replace
                        ((ulong)local_2d8,0,(char *)local_2d8._8_8_,(ulong)local_220._M_current);
              pSVar22 = local_208;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                local_200.field_2._M_allocated_capacity + 1);
              }
              pSVar20 = ShaderCodeVariableDescX::FindMember(this_01,(char *)local_2d8._0_8_);
              if (pSVar20 == (ShaderCodeVariableDescX *)0x0) {
                iVar12 = std::__cxx11::string::compare((char *)local_2d8);
                if (iVar12 != 0) {
                  local_158[0] = local_148;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_158,local_2d8._0_8_,
                             (char *)(local_2d8._8_8_ + local_2d8._0_8_));
                  std::__cxx11::string::operator=((string *)&pSVar22->NameCopy,(string *)local_158);
                  (pSVar22->super_ShaderCodeVariableDesc).Name =
                       (pSVar22->NameCopy)._M_dataplus._M_p;
                  if (local_158[0] != local_148) {
                    operator_delete(local_158[0],local_148[0] + 1);
                  }
                }
                uVar14 = (pSVar22->super_ShaderCodeVariableDesc).ArraySize;
                uVar10 = iVar9 + 1U;
                if (iVar9 + 1U < uVar14) {
                  uVar10 = uVar14;
                }
                (pSVar22->super_ShaderCodeVariableDesc).ArraySize = uVar10;
                std::
                vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                ::emplace_back<Diligent::ShaderCodeVariableDescX>(&this_01->Members,pSVar22);
                pSVar23 = (this_01->Members).
                          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                (this_01->super_ShaderCodeVariableDesc).NumMembers =
                     (Uint32)((ulong)((long)(this_01->Members).
                                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar23) >> 7);
                (this_01->super_ShaderCodeVariableDesc).pMembers =
                     &pSVar23->super_ShaderCodeVariableDesc;
              }
              else {
                uVar14 = (pSVar20->super_ShaderCodeVariableDesc).ArraySize;
                uVar10 = iVar9 + 1U;
                if (iVar9 + 1U < uVar14) {
                  uVar10 = uVar14;
                }
                (pSVar20->super_ShaderCodeVariableDesc).ArraySize = uVar10;
                uVar14 = (pSVar22->super_ShaderCodeVariableDesc).Offset;
                if (uVar14 < (pSVar20->super_ShaderCodeVariableDesc).Offset) {
                  FormatString<char[26],char[29]>
                            (&local_200,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])"Var.Offset >= pArray->Offset",
                             (char (*) [29])(ulong)uVar14);
                  DebugAssertionFailed
                            (local_200._M_dataplus._M_p,"PrepareUBReflection",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0x19e);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_200._M_dataplus._M_p != &local_200.field_2) {
                    operator_delete(local_200._M_dataplus._M_p,
                                    local_200.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                operator_delete((void *)local_2d8._0_8_,stack0xfffffffffffffd38 + 1);
              }
              pSVar22 = pSVar22 + 1;
            } while (pSVar22 != local_228);
          }
          pSVar5 = local_240.
                   super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pSVar23 = local_240.
                    super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_198.super_ShaderCodeBufferDesc.pVariables = (ShaderCodeVariableDesc *)0x0;
          local_198.super_ShaderCodeBufferDesc.NumVariables = 0;
          local_198.super_ShaderCodeBufferDesc.Size = local_f0;
          stack0xfffffffffffffd38 = 0;
          local_198.Variables.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_240.
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_198.Variables.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_240.
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_198.Variables.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_240.
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_2d8._0_8_ = (pointer)0x0;
          local_2d8._8_8_ = (char *)0x0;
          local_240.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_240.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_240.
          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::~vector((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     *)local_2d8);
          local_198.super_ShaderCodeBufferDesc.pVariables = &pSVar23->super_ShaderCodeVariableDesc;
          uVar19 = (ulong)((long)pSVar5 - (long)pSVar23) >> 7;
          iVar9 = (int)uVar19;
          local_198.super_ShaderCodeBufferDesc.NumVariables = iVar9;
          local_288 = local_240.
                      super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_2d8._0_8_ =
               (long)local_240.
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_240.
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 7;
          uVar14 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_2d8);
          local_298._12_4_ = uVar14;
          if (iVar9 != 0) {
            uVar19 = uVar19 & 0xffffffff;
            do {
              ProcessUBVariable(pSVar23,0);
              pSVar23 = pSVar23 + 1;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
          std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::~vector(&local_240);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_p != &local_250) {
            operator_delete(local_260._M_p,
                            CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_p != &local_270) {
            operator_delete(local_280._M_p,
                            CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]
                                    ) + 1);
          }
          std::
          vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
          ::emplace_back<Diligent::ShaderCodeBufferDescX>(&local_c8,&local_198);
          std::
          vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
          ::~vector(&local_198.Variables);
        }
        pcVar18 = local_210 + 0x18;
      } while (pcVar18 != local_168);
    }
    RangeEnd = local_c8.
               super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    RangeStart = local_c8.
                 super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    RawAllocator = GetRawAllocator();
    ShaderCodeBufferDescX::
    PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
              ((ShaderCodeBufferDescX *)local_2a8,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeStart,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeEnd,RawAllocator);
    uVar6 = local_2a8._8_8_;
    this_00 = &local_f8->m_UBReflectionBuffer;
    local_2a8._8_8_ = (ShaderCodeVariableDesc *)0x0;
    ptr = (local_f8->m_UBReflectionBuffer)._M_t.
          super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
          super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
          super__Head_base<0UL,_void_*,_false>._M_head_impl;
    (local_f8->m_UBReflectionBuffer)._M_t.
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)uVar6;
    if (ptr != (void *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)this_00,ptr);
    }
    (this_00->_M_t).
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
    _M_head_impl = (STDDeleter<void,_Diligent::IMemoryAllocator>)local_2a8._0_8_;
    local_2a8._0_8_ = (IMemoryAllocator *)0x0;
    if ((ShaderCodeVariableDesc *)local_2a8._8_8_ != (ShaderCodeVariableDesc *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)local_2a8,(void *)local_2a8._8_8_);
    }
    std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
    ~vector(&local_c8);
  }
  if ((char (*) [30])
      local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char (*) [30])0x0) {
    operator_delete(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ::~vector(&local_138);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_e8.
      super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.
      super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.
      super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.
      super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderResourcesGL::LoadUniforms(const LoadUniformsAttribs& Attribs)
{
    VERIFY(Attribs.SamplerResourceFlag == PIPELINE_RESOURCE_FLAG_NONE || Attribs.SamplerResourceFlag == PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER,
           "Only NONE (for GLSL source) and COMBINED_SAMPLER (for HLSL source) are valid sampler resource flags");

    // Load uniforms to temporary arrays. We will then pack all variables into a single chunk of memory.
    std::vector<UniformBufferInfo> UniformBlocks;
    std::vector<TextureInfo>       Textures;
    std::vector<ImageInfo>         Images;
    std::vector<StorageBlockInfo>  StorageBlocks;
    std::unordered_set<String>     NamesPool;

    // Linear list of unrolled uniform variables grouped by the uniform block index, e.g.:
    //   0: f4, u4, s1.f4[0]
    //   1: s2.s1.f4[0], s3.s2[0].s1.f4[1]
    std::vector<std::vector<ShaderCodeVariableDescX>> UniformVars;

    VERIFY(Attribs.GLProgram, "Null GL program");
    Attribs.State.SetProgram(Attribs.GLProgram);

    GLuint GLProgram = Attribs.GLProgram;
    m_ShaderStages   = Attribs.ShaderStages;

    GLint numActiveUniforms = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORMS, &numActiveUniforms);
    DEV_CHECK_GL_ERROR("Unable to get the number of active uniforms\n");

    // Query the maximum name length of the active uniform (including null terminator)
    GLint activeUniformMaxLength = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_MAX_LENGTH, &activeUniformMaxLength);
    DEV_CHECK_GL_ERROR("Unable to get the maximum uniform name length\n");

    GLint numActiveUniformBlocks = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_BLOCKS, &numActiveUniformBlocks);
    DEV_CHECK_GL_ERROR("Unable to get the number of active uniform blocks\n");

    //
    // #### This parameter is currently unsupported by Intel OGL drivers.
    //
    // Query the maximum name length of the active uniform block (including null terminator)
    GLint activeUniformBlockMaxLength = 0;
    // On Intel driver, this call might fail:
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, &activeUniformBlockMaxLength);
#ifdef DILIGENT_DEVELOPMENT
    if (glGetError() != GL_NO_ERROR)
    {
        LOG_WARNING_MESSAGE("Unable to get the maximum uniform block name length.");
    }
#endif

    if (activeUniformBlockMaxLength <= 0)
        activeUniformBlockMaxLength = 1024;

    auto MaxNameLength = std::max(activeUniformMaxLength, activeUniformBlockMaxLength);

#if GL_ARB_program_interface_query
    GLint numActiveShaderStorageBlocks = 0;
    if (glGetProgramInterfaceiv)
    {
        glGetProgramInterfaceiv(GLProgram, GL_SHADER_STORAGE_BLOCK, GL_ACTIVE_RESOURCES, &numActiveShaderStorageBlocks);
        DEV_CHECK_GL_ERROR("Unable to get the number of shader storage blocks\n");

        // Query the maximum name length of the active shader storage block (including null terminator)
        GLint MaxShaderStorageBlockNameLen = 0;
        glGetProgramInterfaceiv(GLProgram, GL_SHADER_STORAGE_BLOCK, GL_MAX_NAME_LENGTH, &MaxShaderStorageBlockNameLen);
        DEV_CHECK_GL_ERROR("Unable to get the maximum shader storage block name length\n");
        MaxNameLength = std::max(MaxNameLength, MaxShaderStorageBlockNameLen);
    }
#endif

    MaxNameLength = std::max(MaxNameLength, 512);
    std::vector<GLchar> Name(static_cast<size_t>(MaxNameLength) + 1);
    for (int i = 0; i < numActiveUniforms; i++)
    {
        GLenum dataType = 0;
        GLint  size     = 0;
        GLint  NameLen  = 0;
        // If one or more elements of an array are active, the name of the array is returned in 'name',
        // the type is returned in 'type', and the 'size' parameter returns the highest array element index used,
        // plus one, as determined by the compiler and/or linker.
        // Only one active uniform variable will be reported for a uniform array.
        // Uniform variables other than arrays will have a size of 1
        glGetActiveUniform(GLProgram, i, MaxNameLength, &NameLen, &size, &dataType, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform\n");
        VERIFY(NameLen < MaxNameLength && static_cast<size_t>(NameLen) == strlen(Name.data()), "Incorrect uniform name");
        VERIFY(size >= 1, "Size is expected to be at least 1");
        // Note that
        // glGetActiveUniform( program, index, bufSize, length, size, type, name );
        //
        // is equivalent to
        //
        // const enum props[] = { ARRAY_SIZE, TYPE };
        // glGetProgramResourceName( program, UNIFORM, index, bufSize, length, name );
        // glGetProgramResourceiv( program, GL_UNIFORM, index, 1, &props[0], 1, NULL, size );
        // glGetProgramResourceiv( program, GL_UNIFORM, index, 1, &props[1], 1, NULL, (int *)type );
        //
        // The latter is only available in GL 4.4 and GLES 3.1

        RESOURCE_DIMENSION ResDim;
        bool               IsMS;
        GLTextureTypeToResourceDim(dataType, ResDim, IsMS);

        switch (dataType)
        {
            case GL_SAMPLER_1D:
            case GL_SAMPLER_2D:
            case GL_SAMPLER_3D:
            case GL_SAMPLER_CUBE:
            case GL_SAMPLER_1D_SHADOW:
            case GL_SAMPLER_2D_SHADOW:

            case GL_SAMPLER_1D_ARRAY:
            case GL_SAMPLER_2D_ARRAY:
            case GL_SAMPLER_1D_ARRAY_SHADOW:
            case GL_SAMPLER_2D_ARRAY_SHADOW:
            case GL_SAMPLER_CUBE_SHADOW:

            case GL_SAMPLER_EXTERNAL_OES:

            case GL_INT_SAMPLER_1D:
            case GL_INT_SAMPLER_2D:
            case GL_INT_SAMPLER_3D:
            case GL_INT_SAMPLER_CUBE:
            case GL_INT_SAMPLER_1D_ARRAY:
            case GL_INT_SAMPLER_2D_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_1D:
            case GL_UNSIGNED_INT_SAMPLER_2D:
            case GL_UNSIGNED_INT_SAMPLER_3D:
            case GL_UNSIGNED_INT_SAMPLER_CUBE:
            case GL_UNSIGNED_INT_SAMPLER_1D_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_2D_ARRAY:

            case GL_SAMPLER_CUBE_MAP_ARRAY:
            case GL_SAMPLER_CUBE_MAP_ARRAY_SHADOW:
            case GL_INT_SAMPLER_CUBE_MAP_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_CUBE_MAP_ARRAY:

            case GL_SAMPLER_2D_MULTISAMPLE:
            case GL_INT_SAMPLER_2D_MULTISAMPLE:
            case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE:
            case GL_SAMPLER_2D_MULTISAMPLE_ARRAY:
            case GL_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:

            case GL_SAMPLER_BUFFER:
            case GL_INT_SAMPLER_BUFFER:
            case GL_UNSIGNED_INT_SAMPLER_BUFFER:
            {
                const auto IsBuffer =
                    dataType == GL_SAMPLER_BUFFER ||
                    dataType == GL_INT_SAMPLER_BUFFER ||
                    dataType == GL_UNSIGNED_INT_SAMPLER_BUFFER;
                const auto ResourceType = IsBuffer ?
                    SHADER_RESOURCE_TYPE_BUFFER_SRV :
                    SHADER_RESOURCE_TYPE_TEXTURE_SRV;
                const auto ResourceFlags = IsBuffer ?
                    PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER :
                    Attribs.SamplerResourceFlag // PIPELINE_RESOURCE_FLAG_NONE for HLSL source or
                                                // PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER for GLSL source
                    ;

                RemoveArrayBrackets(Name.data());

                Textures.emplace_back(
                    NamesPool.emplace(Name.data()).first->c_str(),
                    Attribs.ShaderStages,
                    ResourceType,
                    ResourceFlags,
                    static_cast<Uint32>(size),
                    dataType,
                    ResDim,
                    IsMS //
                );
                break;
            }

#if GL_ARB_shader_image_load_store
            case GL_IMAGE_1D:
            case GL_IMAGE_2D:
            case GL_IMAGE_3D:
            case GL_IMAGE_2D_RECT:
            case GL_IMAGE_CUBE:
            case GL_IMAGE_BUFFER:
            case GL_IMAGE_1D_ARRAY:
            case GL_IMAGE_2D_ARRAY:
            case GL_IMAGE_CUBE_MAP_ARRAY:
            case GL_IMAGE_2D_MULTISAMPLE:
            case GL_IMAGE_2D_MULTISAMPLE_ARRAY:
            case GL_INT_IMAGE_1D:
            case GL_INT_IMAGE_2D:
            case GL_INT_IMAGE_3D:
            case GL_INT_IMAGE_2D_RECT:
            case GL_INT_IMAGE_CUBE:
            case GL_INT_IMAGE_BUFFER:
            case GL_INT_IMAGE_1D_ARRAY:
            case GL_INT_IMAGE_2D_ARRAY:
            case GL_INT_IMAGE_CUBE_MAP_ARRAY:
            case GL_INT_IMAGE_2D_MULTISAMPLE:
            case GL_INT_IMAGE_2D_MULTISAMPLE_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_1D:
            case GL_UNSIGNED_INT_IMAGE_2D:
            case GL_UNSIGNED_INT_IMAGE_3D:
            case GL_UNSIGNED_INT_IMAGE_2D_RECT:
            case GL_UNSIGNED_INT_IMAGE_CUBE:
            case GL_UNSIGNED_INT_IMAGE_BUFFER:
            case GL_UNSIGNED_INT_IMAGE_1D_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_2D_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_CUBE_MAP_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE:
            case GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE_ARRAY:
            {
                const auto IsBuffer =
                    dataType == GL_IMAGE_BUFFER ||
                    dataType == GL_INT_IMAGE_BUFFER ||
                    dataType == GL_UNSIGNED_INT_IMAGE_BUFFER;
                const auto ResourceType = IsBuffer ?
                    SHADER_RESOURCE_TYPE_BUFFER_UAV :
                    SHADER_RESOURCE_TYPE_TEXTURE_UAV;
                const auto ResourceFlags = IsBuffer ?
                    PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER :
                    PIPELINE_RESOURCE_FLAG_NONE;

                RemoveArrayBrackets(Name.data());

                Images.emplace_back(
                    NamesPool.emplace(Name.data()).first->c_str(),
                    Attribs.ShaderStages,
                    ResourceType,
                    ResourceFlags,
                    static_cast<Uint32>(size),
                    dataType,
                    ResDim,
                    IsMS //
                );
                break;
            }
#endif

            default:
                // Some other uniform type like scalar, matrix etc.
                if (Attribs.LoadUniformBufferReflection)
                {
                    auto VarDesc = GLDataTypeToShaderCodeVariableDesc(dataType);
                    if (VarDesc.BasicType != SHADER_CODE_BASIC_TYPE_UNKNOWN)
                    {
                        // All uniforms are reported as unrolled variables, e.g. s2.s1[1].f4[0]
                        VarDesc.Name = Name.data();
                        AddUniformBufferVariable(GLProgram, i, VarDesc, UniformVars, Attribs.SourceLang);
                    }
                }
                break;
        }
    }

    for (int i = 0; i < numActiveUniformBlocks; i++)
    {
        // In contrast to shader uniforms, every element in uniform block array is enumerated individually
        GLsizei NameLen = 0;
        glGetActiveUniformBlockName(GLProgram, i, MaxNameLength, &NameLen, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform block name\n");
        VERIFY(NameLen < MaxNameLength && static_cast<size_t>(NameLen) == strlen(Name.data()), "Incorrect uniform block name");

        // glGetActiveUniformBlockName( program, uniformBlockIndex, bufSize, length, uniformBlockName );
        // is equivalent to
        // glGetProgramResourceName(program, GL_UNIFORM_BLOCK, uniformBlockIndex, bufSize, length, uniformBlockName);

        auto UniformBlockIndex = glGetUniformBlockIndex(GLProgram, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform block index\n");
        // glGetUniformBlockIndex( program, uniformBlockName );
        // is equivalent to
        // glGetProgramResourceIndex( program, GL_UNIFORM_BLOCK, uniformBlockName );

        bool IsNewBlock = true;

        GLint ArraySize      = 1;
        auto* OpenBracketPtr = strchr(Name.data(), '[');
        if (OpenBracketPtr != nullptr)
        {
            auto Ind        = atoi(OpenBracketPtr + 1);
            ArraySize       = std::max(ArraySize, Ind + 1);
            *OpenBracketPtr = 0;
            if (!UniformBlocks.empty())
            {
                // Look at previous uniform block to check if it is the same array
                auto& LastBlock = UniformBlocks.back();
                if (strcmp(LastBlock.Name, Name.data()) == 0)
                {
                    ArraySize = std::max(ArraySize, static_cast<GLint>(LastBlock.ArraySize));
                    VERIFY(UniformBlockIndex == LastBlock.UBIndex + Ind, "Uniform block indices are expected to be continuous");
                    LastBlock.ArraySize = ArraySize;
                    IsNewBlock          = false;
                }
                else
                {
#ifdef DILIGENT_DEBUG
                    for (const auto& ub : UniformBlocks)
                        VERIFY(strcmp(ub.Name, Name.data()) != 0, "Uniform block with the name '", ub.Name, "' has already been enumerated");
#endif
                }
            }
        }

        if (IsNewBlock)
        {
            UniformBlocks.emplace_back(
                NamesPool.emplace(Name.data()).first->c_str(),
                Attribs.ShaderStages,
                SHADER_RESOURCE_TYPE_CONSTANT_BUFFER,
                static_cast<Uint32>(ArraySize),
                UniformBlockIndex //
            );
        }
    }

#if GL_ARB_shader_storage_buffer_object
    for (int i = 0; i < numActiveShaderStorageBlocks; ++i)
    {
        GLsizei Length = 0;
        glGetProgramResourceName(GLProgram, GL_SHADER_STORAGE_BLOCK, i, MaxNameLength, &Length, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get shader storage block name\n");
        VERIFY(Length < MaxNameLength && static_cast<size_t>(Length) == strlen(Name.data()), "Incorrect shader storage block name");

        auto SBIndex = glGetProgramResourceIndex(GLProgram, GL_SHADER_STORAGE_BLOCK, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get shader storage block index\n");

        bool  IsNewBlock     = true;
        Int32 ArraySize      = 1;
        auto* OpenBracketPtr = strchr(Name.data(), '[');
        if (OpenBracketPtr != nullptr)
        {
            auto Ind        = atoi(OpenBracketPtr + 1);
            ArraySize       = std::max(ArraySize, Ind + 1);
            *OpenBracketPtr = 0;
            if (!StorageBlocks.empty())
            {
                // Look at previous storage block to check if it is the same array
                auto& LastBlock = StorageBlocks.back();
                if (strcmp(LastBlock.Name, Name.data()) == 0)
                {
                    ArraySize = std::max(ArraySize, static_cast<GLint>(LastBlock.ArraySize));
                    VERIFY(static_cast<GLint>(SBIndex) == LastBlock.SBIndex + Ind, "Storage block indices are expected to be continuous");
                    LastBlock.ArraySize = ArraySize;
                    IsNewBlock          = false;
                }
                else
                {
#    ifdef DILIGENT_DEBUG
                    for (const auto& sb : StorageBlocks)
                        VERIFY(strcmp(sb.Name, Name.data()) != 0, "Storage block with the name \"", sb.Name, "\" has already been enumerated");
#    endif
                }
            }
        }

        if (IsNewBlock)
        {
            StorageBlocks.emplace_back(
                NamesPool.emplace(Name.data()).first->c_str(),
                Attribs.ShaderStages,
                SHADER_RESOURCE_TYPE_BUFFER_UAV,
                static_cast<Uint32>(ArraySize),
                SBIndex //
            );
        }
    }
#endif

    Attribs.State.SetProgram(GLObjectWrappers::GLProgramObj::Null());

    AllocateResources(UniformBlocks, Textures, Images, StorageBlocks);

    if (!UniformVars.empty())
    {
        VERIFY_EXPR(Attribs.LoadUniformBufferReflection);

        std::vector<ShaderCodeBufferDescX> UBReflections;
        for (const auto& UB : UniformBlocks)
        {
            if (UB.UBIndex < UniformVars.size())
            {
                auto& Vars = UniformVars[UB.UBIndex];

                GLint BufferSize = 0;
                glGetActiveUniformBlockiv(GLProgram, UB.UBIndex, GL_UNIFORM_BLOCK_DATA_SIZE, &BufferSize);
                DEV_CHECK_GL_ERROR("Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter");

                UBReflections.emplace_back(PrepareUBReflection(std::move(Vars), StaticCast<Uint32>(BufferSize)));
            }
            else
            {
                UNEXPECTED("Uniform block ", UB.UBIndex, " has no variables.");
            }
        }

        m_UBReflectionBuffer = ShaderCodeBufferDescX::PackArray(UBReflections.cbegin(), UBReflections.cend(), GetRawAllocator());
    }
}